

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O3

void __thiscall
google::protobuf::json_internal::ParseProto3Type::SetString
          (ParseProto3Type *this,Field f,Msg *msg,string_view x)

{
  bool bVar1;
  ulong uVar2;
  Msg *pMVar3;
  ResolverPool *pRVar4;
  uint uVar5;
  Msg *pMVar6;
  int iVar7;
  
  RecordAsSeen((Field)this,(Msg *)f);
  iVar7 = *(int *)(*(long *)(this + 8) + 0x50);
  pRVar4 = f[2].pool_;
  if (f->pool_ <= pRVar4) {
    pRVar4 = (ResolverPool *)
             io::EpsCopyOutputStream::EnsureSpaceFallback
                       ((EpsCopyOutputStream *)f,(uint8_t *)pRVar4);
  }
  uVar2 = (ulong)(iVar7 * 8 + 2);
  if (0x7f < (uint)(iVar7 << 3)) {
    do {
      uVar5 = (uint)uVar2;
      *(byte *)&(pRVar4->messages_).
                super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false> =
           (byte)uVar2 | 0x80;
      uVar2 = uVar2 >> 7;
      pRVar4 = (ResolverPool *)
               ((long)&(pRVar4->messages_).
                       super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
               + 1);
    } while (0x3fff < uVar5);
  }
  *(uint8_t *)
   &(pRVar4->messages_).
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false> =
       (uint8_t)uVar2;
  pRVar4 = (ResolverPool *)
           ((long)&(pRVar4->messages_).
                   super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                   .
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
           + 1);
  f[2].pool_ = pRVar4;
  if (f->pool_ <= pRVar4) {
    pRVar4 = (ResolverPool *)
             io::EpsCopyOutputStream::EnsureSpaceFallback
                       ((EpsCopyOutputStream *)f,(uint8_t *)pRVar4);
  }
  pMVar3 = msg;
  pMVar6 = msg;
  if ((Msg *)0x7f < msg) {
    do {
      *(byte *)&(pRVar4->messages_).
                super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false> =
           (byte)pMVar6 | 0x80;
      pRVar4 = (ResolverPool *)
               ((long)&(pRVar4->messages_).
                       super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
               + 1);
      bVar1 = (Msg *)0x3fff < pMVar6;
      pMVar3 = (Msg *)((ulong)pMVar6 >> 7);
      pMVar6 = (Msg *)((ulong)pMVar6 >> 7);
    } while (bVar1);
  }
  *(uint8_t *)
   &(pRVar4->messages_).
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false> =
       (uint8_t)pMVar3;
  pRVar4 = (ResolverPool *)
           ((long)&(pRVar4->messages_).
                   super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                   .
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
           + 1);
  f[2].pool_ = pRVar4;
  iVar7 = (int)msg;
  if ((long)f->pool_ - (long)pRVar4 < (long)iVar7) {
    pRVar4 = (ResolverPool *)
             io::EpsCopyOutputStream::WriteRawFallback
                       ((EpsCopyOutputStream *)f,(void *)x._M_len,iVar7,(uint8_t *)pRVar4);
  }
  else {
    memcpy(pRVar4,(void *)x._M_len,(ulong)msg & 0xffffffff);
    pRVar4 = (ResolverPool *)
             ((long)&(pRVar4->messages_).
                     super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                     .
                     super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
             + (long)iVar7);
  }
  f[2].pool_ = pRVar4;
  return;
}

Assistant:

static void SetString(Field f, Msg& msg, absl::string_view x) {
    RecordAsSeen(f, msg);
    msg.stream_.WriteTag(f->proto().number() << 3 |
                         WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    msg.stream_.WriteVarint64(static_cast<uint64_t>(x.size()));
    msg.stream_.WriteRaw(x.data(), x.size());
  }